

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

bool __thiscall wasm::RemoveUnusedBrs::optimizeLoop(RemoveUnusedBrs *this,Loop *loop)

{
  bool bVar1;
  Index IVar2;
  BranchSeeker *this_00;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_01;
  size_t sVar3;
  Expression **ppEVar4;
  Break *pBVar5;
  Module *pMVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  Block *pBVar9;
  ulong uVar10;
  Unary *pUVar11;
  If *pIVar12;
  PassOptions *passOptions;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  optional<wasm::Type> type__02;
  optional<wasm::Type> type__03;
  optional<wasm::Type> type__04;
  optional<wasm::Type> type__05;
  Name target;
  optional<wasm::Type> type;
  EffectAnalyzer local_2b8;
  optional<wasm::Type> local_150;
  optional<wasm::Type> local_138;
  size_t local_128;
  char *local_120;
  Expression *local_118;
  Expression **local_110;
  Break *local_108;
  Break *brIf;
  optional<wasm::Type> local_f8;
  optional<wasm::Type> local_e0;
  BasicType local_d0 [2];
  optional<wasm::Type> local_c8;
  optional<wasm::Type> local_b0;
  BasicType local_9c;
  anon_class_8_1_911e227b local_98;
  anon_class_8_1_911e227b blockifyMerge;
  optional<wasm::Type> local_88;
  optional<wasm::Type> local_70;
  BasicType local_5c;
  If *local_58;
  If *iff;
  Expression *curr;
  Builder builder;
  Index i;
  Break *last;
  ExpressionList *list;
  Block *block;
  Loop *loop_local;
  RemoveUnusedBrs *this_local;
  
  bVar1 = IString::is(&(loop->name).super_IString);
  if ((bVar1) &&
     (this_00 = (BranchSeeker *)Expression::dynCast<wasm::Block>(loop->body),
     this_00 != (BranchSeeker *)0x0)) {
    this_01 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
              ((this_00->
               super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               ).
               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               .stack.fixed._M_elems + 1);
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(this_01);
    if (1 < sVar3) {
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back(this_01);
      pBVar5 = Expression::dynCast<wasm::Break>(*ppEVar4);
      if (((pBVar5 != (Break *)0x0) && (bVar1 = ExpressionAnalyzer::isSimple(pBVar5), bVar1)) &&
         (bVar1 = IString::operator!=(&(pBVar5->name).super_IString,&(loop->name).super_IString),
         !bVar1)) {
        sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(this_01);
        builder.wasm._4_4_ = (int)sVar3 - 2;
        pMVar6 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                 getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                            ).
                            super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                            .
                            super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                          );
        Builder::Builder((Builder *)&curr,pMVar6);
        while( true ) {
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (this_01,(ulong)builder.wasm._4_4_);
          iff = (If *)*ppEVar4;
          local_58 = Expression::dynCast<wasm::If>((Expression *)iff);
          if (local_58 != (If *)0x0) break;
          local_108 = Expression::dynCast<wasm::Break>((Expression *)iff);
          if (local_108 != (Break *)0x0) {
            if (((local_108->condition != (Expression *)0x0) &&
                (local_108->value == (Expression *)0x0)) &&
               (bVar1 = IString::operator!=(&(local_108->name).super_IString,
                                            &(loop->name).super_IString), bVar1)) {
              uVar10 = (ulong)builder.wasm._4_4_;
              sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                (this_01);
              if (uVar10 == sVar3 - 2) {
                pUVar11 = Builder::makeUnary((Builder *)&curr,EqZInt32,local_108->condition);
                local_108->condition = (Expression *)pUVar11;
                wasm::Name::operator=(&pBVar5->name,&local_108->name);
                wasm::Name::operator=(&local_108->name,&loop->name);
                return true;
              }
              bVar1 = IString::operator==(&(local_108->name).super_IString,
                                          (IString *)
                                          &(this_00->
                                           super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                           ).
                                           super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                           .stack.fixed);
              if (bVar1) {
                local_118 = (Expression *)
                            (this_00->
                            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            ).
                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            .stack.fixed._M_elems[0].func;
                local_110 = (this_00->
                            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            ).
                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            .stack.fixed._M_elems[0].currp;
                target.super_IString.str._M_str = (char *)local_118;
                target.super_IString.str._M_len = (size_t)local_110;
                IVar2 = BranchUtils::BranchSeeker::count(this_00,local_118,target);
                if (IVar2 == 1) {
                  pEVar7 = local_108->condition;
                  local_128 = (local_108->name).super_IString.str._M_len;
                  local_120 = (local_108->name).super_IString.str._M_str;
                  pBVar5 = Builder::makeBreak((Builder *)&curr,
                                              (Name)(local_108->name).super_IString.str,
                                              (Expression *)0x0,(Expression *)0x0);
                  IVar2 = builder.wasm._4_4_ + 1;
                  sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                    (this_01);
                  pEVar8 = stealSlice((Builder *)&curr,(Block *)this_00,IVar2,(Index)sVar3);
                  std::optional<wasm::Type>::optional(&local_138);
                  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
                  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._M_payload =
                       local_138.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Type>._M_payload;
                  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._M_engaged =
                       local_138.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Type>._M_engaged;
                  pIVar12 = Builder::makeIf((Builder *)&curr,pEVar7,(Expression *)pBVar5,pEVar8,type
                                           );
                  ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            operator[](this_01,(ulong)builder.wasm._4_4_);
                  *ppEVar4 = (Expression *)pIVar12;
                  std::optional<wasm::Type>::optional(&local_150);
                  type__05.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
                  type__05.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._M_payload =
                       local_150.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Type>._M_payload;
                  type__05.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._M_engaged =
                       local_150.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Type>._M_engaged;
                  Block::finalize((Block *)this_00,type__05,Unknown);
                  return true;
                }
              }
            }
            return false;
          }
          passOptions = Pass::getPassOptions((Pass *)this);
          pMVar6 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                   getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                              ).
                              super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                              .
                              super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                            );
          EffectAnalyzer::EffectAnalyzer(&local_2b8,passOptions,pMVar6,(Expression *)iff);
          bVar1 = EffectAnalyzer::transfersControlFlow(&local_2b8);
          EffectAnalyzer::~EffectAnalyzer(&local_2b8);
          if (bVar1) {
            return false;
          }
          if (builder.wasm._4_4_ == 0) {
            return false;
          }
          builder.wasm._4_4_ = builder.wasm._4_4_ - 1;
        }
        if (local_58->ifFalse == (Expression *)0x0) {
          local_5c = unreachable;
          bVar1 = wasm::Type::operator==(&local_58->ifTrue->type,&local_5c);
          if (bVar1) {
            IVar2 = builder.wasm._4_4_ + 1;
            sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                              (this_01);
            pEVar7 = stealSlice((Builder *)&curr,(Block *)this_00,IVar2,(Index)sVar3);
            pIVar12 = local_58;
            local_58->ifFalse = pEVar7;
            std::optional<wasm::Type>::optional(&local_70);
            type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._9_7_ = 0;
            type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 local_70.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Type>._M_payload;
            type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_engaged =
                 local_70.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Type>._M_engaged;
            If::finalize(pIVar12,type_);
            std::optional<wasm::Type>::optional(&local_88);
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._9_7_ = 0;
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 local_88.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Type>._M_payload;
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_engaged =
                 local_88.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Type>._M_engaged;
            Block::finalize((Block *)this_00,type__00,Unknown);
            return true;
          }
        }
        else {
          blockifyMerge.builder._0_4_ = 1;
          bVar1 = wasm::Type::operator!=(&local_58->condition->type,(BasicType *)&blockifyMerge);
          if (bVar1) {
            bVar1 = wasm::Type::isConcrete
                              (&(local_58->super_SpecificExpression<(wasm::Expression::Id)2>).
                                super_Expression.type);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              __assert_fail("!iff->type.isConcrete()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                            ,0x279,"bool wasm::RemoveUnusedBrs::optimizeLoop(Loop *)");
            }
            local_98.builder = (Builder *)&curr;
            local_9c = unreachable;
            bVar1 = wasm::Type::operator==(&local_58->ifTrue->type,&local_9c);
            if (bVar1) {
              pEVar7 = local_58->ifFalse;
              IVar2 = builder.wasm._4_4_ + 1;
              sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                (this_01);
              pEVar8 = stealSlice((Builder *)&curr,(Block *)this_00,IVar2,(Index)sVar3);
              pBVar9 = optimizeLoop::anon_class_8_1_911e227b::operator()(&local_98,pEVar7,pEVar8);
              pIVar12 = local_58;
              local_58->ifFalse = (Expression *)pBVar9;
              std::optional<wasm::Type>::optional(&local_b0);
              type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._9_7_ = 0;
              type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   local_b0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Type>._M_payload;
              type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_engaged =
                   local_b0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Type>._M_engaged;
              If::finalize(pIVar12,type__01);
              std::optional<wasm::Type>::optional(&local_c8);
              type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._9_7_ = 0;
              type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   local_c8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Type>._M_payload;
              type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_engaged =
                   local_c8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Type>._M_engaged;
              Block::finalize((Block *)this_00,type__02,Unknown);
              return true;
            }
            local_d0[0] = unreachable;
            bVar1 = wasm::Type::operator==(&local_58->ifFalse->type,local_d0);
            if (bVar1) {
              pEVar7 = local_58->ifTrue;
              IVar2 = builder.wasm._4_4_ + 1;
              sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                (this_01);
              pEVar8 = stealSlice((Builder *)&curr,(Block *)this_00,IVar2,(Index)sVar3);
              pBVar9 = optimizeLoop::anon_class_8_1_911e227b::operator()(&local_98,pEVar7,pEVar8);
              pIVar12 = local_58;
              local_58->ifTrue = (Expression *)pBVar9;
              std::optional<wasm::Type>::optional(&local_e0);
              type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._9_7_ = 0;
              type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   local_e0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Type>._M_payload;
              type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_engaged =
                   local_e0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Type>._M_engaged;
              If::finalize(pIVar12,type__03);
              std::optional<wasm::Type>::optional(&local_f8);
              type__04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._9_7_ = 0;
              type__04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   local_f8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Type>._M_payload;
              type__04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_engaged =
                   local_f8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Type>._M_engaged;
              Block::finalize((Block *)this_00,type__04,Unknown);
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool optimizeLoop(Loop* loop) {
    // if a loop ends in
    // (loop $in
    //   (block $out
    //     if (..) br $in; else br $out;
    //   )
    // )
    // then our normal opts can remove the break out since it flows directly out
    // (and later passes make the if one-armed). however, the simple analysis
    // fails on patterns like
    //     if (..) br $out;
    //     br $in;
    // which is a common way to do a while (1) loop (end it with a jump to the
    // top), so we handle that here. Specifically we want to conditionalize
    // breaks to the loop top, i.e., put them behind a condition, so that other
    // code can flow directly out and thus brs out can be removed. (even if
    // the change is to let a break somewhere else flow out, that can still be
    // helpful, as it shortens the logical loop. it is also good to generate
    // an if-else instead of an if, as it might allow an eqz to be removed
    // by flipping arms)
    if (!loop->name.is()) {
      return false;
    }
    auto* block = loop->body->dynCast<Block>();
    if (!block) {
      return false;
    }
    // does the last element break to the top of the loop?
    auto& list = block->list;
    if (list.size() <= 1) {
      return false;
    }
    auto* last = list.back()->dynCast<Break>();
    if (!last || !ExpressionAnalyzer::isSimple(last) ||
        last->name != loop->name) {
      return false;
    }
    // last is a simple break to the top of the loop. if we can conditionalize
    // it, it won't block things from flowing out and not needing breaks to do
    // so.
    Index i = list.size() - 2;
    Builder builder(*getModule());
    while (1) {
      auto* curr = list[i];
      if (auto* iff = curr->dynCast<If>()) {
        // let's try to move the code going to the top of the loop into the
        // if-else
        if (!iff->ifFalse) {
          // we need the ifTrue to break, so it cannot reach the code we want to
          // move
          if (iff->ifTrue->type == Type::unreachable) {
            iff->ifFalse = stealSlice(builder, block, i + 1, list.size());
            iff->finalize();
            block->finalize();
            return true;
          }
        } else if (iff->condition->type != Type::unreachable) {
          // This is already an if-else. If one side is a dead end, we can
          // append to the other, if there is no returned value to concern us.
          // Note that we skip ifs with unreachable conditions, as they are dead
          // code that DCE can remove, and modifying them can lead to errors
          // (one of the arms may still be concrete, in which case appending to
          // it would be invalid).

          // can't be, since in the middle of a block
          assert(!iff->type.isConcrete());

          // ensures the first node is a block, if it isn't already, and merges
          // in the second, either as a single element or, if a block, by
          // appending to the first block. this keeps the order of operations in
          // place, that is, the appended element will be executed after the
          // first node's elements
          auto blockifyMerge = [&](Expression* any,
                                   Expression* append) -> Block* {
            Block* block = nullptr;
            if (any) {
              block = any->dynCast<Block>();
            }
            // if the first isn't a block, or it's a block with a name (so we
            // might branch to the end, and so can't append to it, we might skip
            // that code!) then make a new block
            if (!block || block->name.is()) {
              block = builder.makeBlock(any);
            } else {
              assert(!block->type.isConcrete());
            }
            auto* other = append->dynCast<Block>();
            if (!other) {
              block->list.push_back(append);
            } else {
              for (auto* item : other->list) {
                block->list.push_back(item);
              }
            }
            block->finalize();
            return block;
          };

          if (iff->ifTrue->type == Type::unreachable) {
            iff->ifFalse = blockifyMerge(
              iff->ifFalse, stealSlice(builder, block, i + 1, list.size()));
            iff->finalize();
            block->finalize();
            return true;
          } else if (iff->ifFalse->type == Type::unreachable) {
            iff->ifTrue = blockifyMerge(
              iff->ifTrue, stealSlice(builder, block, i + 1, list.size()));
            iff->finalize();
            block->finalize();
            return true;
          }
        }
        return false;
      } else if (auto* brIf = curr->dynCast<Break>()) {
        // br_if is similar to if.
        if (brIf->condition && !brIf->value && brIf->name != loop->name) {
          if (i == list.size() - 2) {
            // there is the br_if, and then the br to the top, so just flip them
            // and the condition
            brIf->condition = builder.makeUnary(EqZInt32, brIf->condition);
            last->name = brIf->name;
            brIf->name = loop->name;
            return true;
          } else {
            // there are elements in the middle,
            //   br_if $somewhere (condition)
            //   (..more..)
            //   br $in
            // we can convert the br_if to an if. this has a cost, though,
            // so only do it if it looks useful, which it definitely is if
            //  (a) $somewhere is straight out (so the br out vanishes), and
            //  (b) this br_if is the only branch to that block (so the block
            //      will vanish)
            if (brIf->name == block->name &&
                BranchUtils::BranchSeeker::count(block, block->name) == 1) {
              // note that we could drop the last element here, it is a br we
              // know for sure is removable, but telling stealSlice to steal all
              // to the end is more efficient, it can just truncate.
              list[i] =
                builder.makeIf(brIf->condition,
                               builder.makeBreak(brIf->name),
                               stealSlice(builder, block, i + 1, list.size()));
              block->finalize();
              return true;
            }
          }
        }
        return false;
      }
      // if there is control flow, we must stop looking
      if (EffectAnalyzer(getPassOptions(), *getModule(), curr)
            .transfersControlFlow()) {
        return false;
      }
      if (i == 0) {
        return false;
      }
      i--;
    }
  }